

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qresource.cpp
# Opt level: O2

int __thiscall QResourceFileEngine::open(QResourceFileEngine *this,char *__file,int __oflag,...)

{
  QResource *this_00;
  QResourceFileEnginePrivate *this_01;
  qsizetype qVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  long lVar4;
  bool bVar5;
  Compression CVar6;
  int iVar7;
  long in_FS_OFFSET;
  QMessageLogger local_58;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = (QResourceFileEnginePrivate *)(this->super_QAbstractFileEngine).d_ptr.d;
  this_00 = &this_01->resource;
  QResource::fileName((QString *)&local_58,this_00);
  lVar4 = CONCAT44(local_58.context.function._4_4_,local_58.context.function._0_4_);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
  if (lVar4 == 0) {
    local_58.context.version = 2;
    local_58.context.function._4_4_ = 0;
    local_58.context.line = 0;
    local_58.context.file._0_4_ = 0;
    local_58.context.file._4_4_ = 0;
    local_58.context.function._0_4_ = 0;
    local_58.context.category = "default";
    iVar7 = 0;
    QMessageLogger::warning(&local_58,"QResourceFileEngine::open: Missing file name");
    goto LAB_002384ce;
  }
  if (((ulong)__file & 2) == 0) {
    CVar6 = QResource::compressionAlgorithm(this_00);
    if (CVar6 == NoCompression) {
LAB_00238487:
      bVar5 = QResource::isValid(this_00);
      iVar7 = (int)CONCAT71((uint7)((ulong)__file >> 8) & 0xffffff,1);
      if (bVar5) goto LAB_002384ce;
      iVar7 = 2;
    }
    else {
      QResourceFileEnginePrivate::uncompress(this_01);
      bVar5 = QByteArray::isNull(&this_01->uncompressed);
      if (!bVar5) goto LAB_00238487;
      iVar7 = 5;
    }
    QSystemError::stdString((QString *)&local_58,iVar7);
    pDVar2 = (this_01->super_QAbstractFileEnginePrivate).errorString.d.d;
    pcVar3 = (this_01->super_QAbstractFileEnginePrivate).errorString.d.ptr;
    (this_01->super_QAbstractFileEnginePrivate).errorString.d.d =
         (Data *)CONCAT44(local_58.context.line,local_58.context.version);
    (this_01->super_QAbstractFileEnginePrivate).errorString.d.ptr =
         (char16_t *)CONCAT44(local_58.context.file._4_4_,local_58.context.file._0_4_);
    local_58.context.version = (int)pDVar2;
    local_58.context.line = (int)((ulong)pDVar2 >> 0x20);
    local_58.context.file._0_4_ = SUB84(pcVar3,0);
    local_58.context.file._4_4_ = (undefined4)((ulong)pcVar3 >> 0x20);
    qVar1 = (this_01->super_QAbstractFileEnginePrivate).errorString.d.size;
    (this_01->super_QAbstractFileEnginePrivate).errorString.d.size =
         CONCAT44(local_58.context.function._4_4_,local_58.context.function._0_4_);
    local_58.context.function._0_4_ = (undefined4)qVar1;
    local_58.context.function._4_4_ = (undefined4)((ulong)qVar1 >> 0x20);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
  }
  iVar7 = 0;
LAB_002384ce:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return iVar7;
  }
  __stack_chk_fail();
}

Assistant:

bool QResourceFileEngine::open(QIODevice::OpenMode flags,
                               std::optional<QFile::Permissions> permissions)
{
    Q_UNUSED(permissions);

    Q_D(QResourceFileEngine);
    if (d->resource.fileName().isEmpty()) {
        qWarning("QResourceFileEngine::open: Missing file name");
        return false;
    }
    if (flags & QIODevice::WriteOnly)
        return false;
    if (d->resource.compressionAlgorithm() != QResource::NoCompression) {
        d->uncompress();
        if (d->uncompressed.isNull()) {
            d->errorString = QSystemError::stdString(EIO);
            return false;
        }
    }
    if (!d->resource.isValid()) {
        d->errorString = QSystemError::stdString(ENOENT);
        return false;
    }
    return true;
}